

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void nullcPrintArrayVariableInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  int iVar1;
  char *pcVar2;
  ExternTypeInfo *pEVar3;
  void *pvVar4;
  ExternTypeInfo *type_00;
  uint local_64;
  uint i;
  ExternTypeInfo *elementType;
  markerType *marker;
  void *base;
  NULLCArray *arr;
  int *piStack_38;
  uint size;
  char *target;
  ExternTypeInfo *codeTypes;
  char *codeSymbols;
  uint indentDepth_local;
  char *ptr_local;
  ExternTypeInfo *type_local;
  
  pcVar2 = nullcDebugSymbols((uint *)0x0);
  pEVar3 = nullcDebugTypeInfo((uint *)0x0);
  arr._4_4_ = (type->field_8).arrSize;
  piStack_38 = (int *)ptr;
  if ((type->field_8).arrSize == 0xffffffff) {
    piStack_38 = *(int **)ptr;
    arr._4_4_ = *(uint *)(ptr + 8);
    nullcPrintDepthIndent(indentDepth);
    printf("%s[] data = ",pcVar2 + pEVar3[(type->field_11).subType].offsetToName);
    pvVar4 = NULLC::GetBasePointer(piStack_38);
    if (pvVar4 == (void *)0x0) {
      printf("%p\n",piStack_38);
    }
    else {
      printf("%p [base %p, ",piStack_38,pvVar4);
      nullcPrintPointerMarkerInfo(*(markerType *)((long)pvVar4 + -8));
      printf("]\n");
    }
    nullcPrintDepthIndent(indentDepth);
    printf("len %u\n",(ulong)*(uint *)(ptr + 8));
  }
  if (type->pointerCount != 0) {
    type_00 = pEVar3 + (type->field_11).subType;
    for (local_64 = 0; local_64 < arr._4_4_ && local_64 < 0x20; local_64 = local_64 + 1) {
      nullcPrintDepthIndent(indentDepth);
      printf("[%u]",(ulong)local_64);
      if ((type_00->subCat == CAT_NONE) || (type_00->subCat == CAT_POINTER)) {
        printf(" = ");
        nullcPrintBasicVariableInfo(type_00,(char *)piStack_38);
        printf("\n");
      }
      else {
        iVar1 = strcmp(pcVar2 + type_00->offsetToName,"typeid");
        if (iVar1 == 0) {
          printf(" = %s\n",pcVar2 + pEVar3[*piStack_38].offsetToName);
        }
        else {
          printf("\n");
          nullcPrintVariableInfo(type_00,(char *)piStack_38,indentDepth + 1);
        }
      }
      piStack_38 = (int *)((long)piStack_38 + (ulong)type_00->size);
    }
  }
  return;
}

Assistant:

void nullcPrintArrayVariableInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(NULL);

	char *target = ptr;
	unsigned size = type.arrSize;

	if(type.arrSize == ~0u)
	{
		NULLCArray *arr = (NULLCArray*)ptr;

		target = arr->ptr;
		size = arr->len;

		nullcPrintDepthIndent(indentDepth);
		printf("%s[] data = ", codeSymbols + codeTypes[type.subType].offsetToName);

		if(void *base = NULLC::GetBasePointer(target))
		{
			markerType *marker = (markerType*)((char*)base - sizeof(markerType));

			printf("%p [base %p, ", target, base);
			nullcPrintPointerMarkerInfo(*marker);
			printf("]\n");
		}
		else
		{
			printf("%p\n", target);
		}

		nullcPrintDepthIndent(indentDepth);
		printf("len %u\n", arr->len);
	}

	if(type.pointerCount)
	{
		ExternTypeInfo &elementType = codeTypes[type.subType];

		for(unsigned i = 0; i < size && i < 32; i++)
		{
			nullcPrintDepthIndent(indentDepth);
			printf("[%u]", i);

			if(elementType.subCat == ExternTypeInfo::CAT_NONE || elementType.subCat == ExternTypeInfo::CAT_POINTER)
			{
				printf(" = ");
				nullcPrintBasicVariableInfo(elementType, target);
				printf("\n");
			}
			else if(strcmp(codeSymbols + elementType.offsetToName, "typeid") == 0)
			{
				printf(" = %s\n", codeSymbols + codeTypes[*(int*)(target)].offsetToName);
			}
			else
			{
				printf("\n");
				nullcPrintVariableInfo(elementType, target, indentDepth + 1);
			}

			target += elementType.size;
		}
	}
}